

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::createSlice
          (HighsSparseMatrix *this,HighsSparseMatrix *matrix,HighsInt from_col,HighsInt to_col)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar2;
  long lVar3;
  HighsInt HVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  pointer pdVar10;
  size_type __new_size;
  long lVar11;
  
  HVar4 = matrix->num_row_;
  this_00 = &this->start_;
  lVar3 = (long)to_col + 1;
  piVar6 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (long)piVar6[(long)to_col + 1] - (long)piVar6[from_col];
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)((to_col - from_col) + 2));
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,__new_size);
  iVar1 = (to_col - from_col) + 1;
  piVar6 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = piVar6 + from_col;
  iVar5 = *piVar2;
  if (from_col <= to_col) {
    piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      piVar7[lVar11] = piVar2[lVar11] - iVar5;
      lVar11 = lVar11 + 1;
    } while ((to_col - from_col) + 1 != (int)lVar11);
  }
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [iVar1] = (int)__new_size;
  lVar11 = (long)*piVar2;
  if (*piVar2 < piVar6[lVar3]) {
    piVar7 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar9[lVar11 - iVar5] = piVar7[lVar11];
      pdVar10[lVar11 - iVar5] = pdVar8[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 < piVar6[lVar3]);
  }
  this->num_col_ = iVar1;
  this->num_row_ = HVar4;
  this->format_ = kColwise;
  return;
}

Assistant:

void HighsSparseMatrix::createSlice(const HighsSparseMatrix& matrix,
                                    const HighsInt from_col,
                                    const HighsInt to_col) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());
  HighsInt num_row = matrix.num_row_;
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& slice_start = this->start_;
  vector<HighsInt>& slice_index = this->index_;
  vector<double>& slice_value = this->value_;
  HighsInt slice_num_col = to_col + 1 - from_col;
  HighsInt slice_num_nz = a_start[to_col + 1] - a_start[from_col];
  slice_start.resize(slice_num_col + 1);
  slice_index.resize(slice_num_nz);
  slice_value.resize(slice_num_nz);
  HighsInt from_col_start = a_start[from_col];
  for (HighsInt iCol = from_col; iCol < to_col + 1; iCol++)
    slice_start[iCol - from_col] = a_start[iCol] - from_col_start;
  slice_start[slice_num_col] = slice_num_nz;
  for (HighsInt iEl = a_start[from_col]; iEl < a_start[to_col + 1]; iEl++) {
    slice_index[iEl - from_col_start] = a_index[iEl];
    slice_value[iEl - from_col_start] = a_value[iEl];
  }
  this->num_col_ = slice_num_col;
  this->num_row_ = num_row;
  this->format_ = MatrixFormat::kColwise;
}